

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O1

bool __thiscall tinyusdz::ascii::AsciiParser::ParseAttrMeta(AsciiParser *this,AttrMeta *out_meta)

{
  uint64_t *puVar1;
  uint8_t uVar2;
  StreamReader *pSVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  undefined1 *puVar6;
  bool bVar7;
  undefined1 uVar8;
  int iVar9;
  const_iterator cVar10;
  ostream *poVar11;
  mapped_type *pmVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  ulong uVar13;
  long lVar14;
  AttrMeta *pAVar15;
  char *pcVar16;
  optional<tinyusdz::Token> *this_00;
  optional<std::__cxx11::string> *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  uint uVar17;
  uint8_t unaff_R13B;
  bool bVar18;
  double value;
  string name_err;
  string varname;
  StringData sdata;
  bool local_2e1;
  storage_t<double> local_2e0;
  long local_2d8;
  long local_2d0 [2];
  AttrMeta *local_2c0;
  undefined1 local_2b8 [8];
  undefined1 local_2b0 [104];
  string local_248;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
  *local_228;
  undefined1 local_220 [8];
  undefined1 local_218 [8];
  undefined1 local_210 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  undefined1 auStack_1f8 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0;
  _Alloc_hider local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  _Alloc_hider local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170 [12];
  long *local_a8 [2];
  long local_98 [2];
  optional<std::map<std::__cxx11::string,tinyusdz::MetaVariable,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::MetaVariable>>>>
  *local_88;
  optional<tinyusdz::Token> *local_80;
  optional<tinyusdz::Token> *local_78;
  optional<tinyusdz::Token> *local_70;
  optional<std::__cxx11::string> *local_68;
  optional<std::__cxx11::string> *local_60;
  optional<tinyusdz::Token> *local_58;
  optional<std::map<std::__cxx11::string,tinyusdz::MetaVariable,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::MetaVariable>>>>
  *local_50;
  _Base_ptr local_48;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>_>
  *local_40;
  vector<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_> *local_38;
  
  bVar7 = SkipWhitespace(this);
  if (!bVar7) {
    return false;
  }
  pSVar3 = this->_sr;
  uVar13 = pSVar3->idx_ + 1;
  bVar18 = true;
  bVar7 = uVar13 <= pSVar3->length_;
  if (uVar13 <= pSVar3->length_) {
    uVar2 = pSVar3->binary_[pSVar3->idx_];
    pSVar3->idx_ = uVar13;
    bVar18 = uVar2 == '(';
  }
  if (!bVar18) {
    bVar7 = false;
    if ((0 < (long)pSVar3->idx_) && (uVar13 = pSVar3->idx_ - 1, uVar13 <= pSVar3->length_)) {
      pSVar3->idx_ = uVar13;
      bVar7 = false;
    }
  }
  if (!bVar7) {
    return (bool)(bVar18 ^ 1);
  }
  bVar7 = SkipWhitespaceAndNewline(this,true);
  if (!bVar7) {
    return false;
  }
  pSVar3 = this->_sr;
  pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pSVar3->length_;
  pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pSVar3->idx_;
  if (pbVar4 <= pbVar5) {
    return true;
  }
  puVar1 = &pSVar3->idx_;
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pSVar3->length_;
  local_40 = &this->_supported_prop_metas;
  local_48 = &(this->_supported_prop_metas)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_228 = &out_meta->meta;
  local_88 = (optional<std::map<std::__cxx11::string,tinyusdz::MetaVariable,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::MetaVariable>>>>
              *)&out_meta->sdrMetadata;
  local_80 = &out_meta->outputName;
  local_78 = &out_meta->renderType;
  local_70 = &out_meta->connectability;
  local_68 = (optional<std::__cxx11::string> *)&out_meta->displayGroup;
  local_60 = (optional<std::__cxx11::string> *)&out_meta->displayName;
  local_58 = &out_meta->bindMaterialAs;
  local_50 = (optional<std::map<std::__cxx11::string,tinyusdz::MetaVariable,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::MetaVariable>>>>
              *)&out_meta->customData;
  local_38 = &out_meta->stringData;
  if (*(uint8_t *)((long)&(pbVar5->_M_dataplus)._M_p + (long)pSVar3->binary_) == '\0') {
    return true;
  }
  args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)&(pbVar5->_M_dataplus)._M_p + 1);
  if (args_1 <= pbVar4) {
    unaff_R13B = *(uint8_t *)((long)&(pbVar5->_M_dataplus)._M_p + (long)pSVar3->binary_);
    *puVar1 = (uint64_t)args_1;
  }
  uVar17 = 1;
  if (pbVar4 < args_1) goto LAB_0038615f;
  if (unaff_R13B == ')') {
    uVar17 = 3;
    goto LAB_0038615f;
  }
  uVar13 = *puVar1 - 1;
  if (((long)uVar13 < 0) || (*(ulong *)args < uVar13)) goto LAB_0038615f;
  *puVar1 = uVar13;
  local_220 = (undefined1  [8])local_210;
  local_218 = (undefined1  [8])0x0;
  local_210 = (undefined1  [8])((ulong)local_210 & 0xffffffffffffff00);
  local_208._M_local_buf[8] = false;
  local_208._M_local_buf[9] = false;
  local_208._12_4_ = 0;
  auStack_1f8._0_4_ = 0;
  bVar7 = MaybeTripleQuotedString(this,(StringData *)local_220);
  if ((bVar7) || (bVar7 = MaybeString(this,(StringData *)local_220), bVar7)) {
    ::std::vector<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>::
    push_back(local_38,(StringData *)local_220);
    bVar7 = SkipWhitespaceAndNewline(this,true);
    uVar17 = bVar7 + 1;
    bVar7 = false;
  }
  else {
    uVar17 = 0;
    bVar7 = true;
  }
  if (local_220 != (undefined1  [8])local_210) {
    operator_delete((void *)local_220,(ulong)((long)local_210 + 1));
  }
  if (!bVar7) goto LAB_0038615f;
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  local_248._M_string_length = 0;
  local_248.field_2._M_local_buf[0] = '\0';
  bVar7 = ReadIdentifier(this,&local_248);
  if (bVar7) {
    cVar10 = ::std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>_>
             ::find(&local_40->_M_t,&local_248);
    if (cVar10._M_node == local_48) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_220);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_220,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_220,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_220,"[ASCII]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_220,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_220,"ParseAttrMeta",0xd)
      ;
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_220,"():",3);
      poVar11 = (ostream *)::std::ostream::operator<<((ostringstream *)local_220,0xce0);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
      local_2e0 = (storage_t<double>)local_2d0;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2e0,"Unsupported Property metadatum name: {}","");
      fmt::format<std::__cxx11::string>
                ((string *)local_2b8,(fmt *)&local_2e0,(string *)&local_248,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
      poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_220,(char *)local_2b8,local_2b0._0_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
      if (local_2b8 != (undefined1  [8])((long)local_2b0 + 8)) {
        operator_delete((void *)local_2b8,CONCAT71(local_2b0._9_7_,local_2b0[8]) + 1);
      }
      if (local_2e0 != (storage_t<double>)local_2d0) {
        operator_delete((void *)local_2e0,local_2d0[0] + 1);
      }
      ::std::__cxx11::stringbuf::str();
      PushError(this,(string *)local_2b8);
      if (local_2b8 != (undefined1  [8])((long)local_2b0 + 8)) {
        operator_delete((void *)local_2b8,CONCAT71(local_2b0._9_7_,local_2b0[8]) + 1);
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_220);
      ::std::ios_base::~ios_base((ios_base *)local_1b0._M_local_buf);
      goto LAB_0038612c;
    }
    local_2b8 = (undefined1  [8])((long)local_2b0 + 8);
    local_2b0._0_8_ = (pointer)0x0;
    local_2b0[8] = '\0';
    local_2e0 = (storage_t<double>)local_2d0;
    local_2c0 = out_meta;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"");
    Path::Path((Path *)local_220,(string *)&local_2e0,&local_248);
    bVar7 = pathutil::ValidatePropPath((Path *)local_220,(string *)local_2b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_p != local_170) {
      operator_delete(local_180._M_p,local_170[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_p != &local_190) {
      operator_delete(local_1a0._M_p,local_190._M_allocated_capacity + 1);
    }
    pAVar15 = local_2c0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0[1]._0_8_ != &local_1b0) {
      operator_delete((void *)local_1d0[1]._0_8_,local_1b0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)auStack_1f8._24_8_ != local_1d0) {
      operator_delete((void *)auStack_1f8._24_8_,local_1d0[0]._M_allocated_capacity + 1);
    }
    puVar6 = (undefined1 *)CONCAT44(local_208._12_4_,CONCAT22(local_208._10_2_,local_208._8_2_));
    if (puVar6 != auStack_1f8 + 8) {
      operator_delete(puVar6,auStack_1f8._8_8_ + 1);
    }
    if (local_220 != (undefined1  [8])local_210) {
      operator_delete((void *)local_220,(ulong)((long)local_210 + 1));
    }
    if (local_2e0 != (storage_t<double>)local_2d0) {
      operator_delete((void *)local_2e0,local_2d0[0] + 1);
    }
    if (!bVar7) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_220);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_220,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_220,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_220,"[ASCII]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_220,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_220,"ParseAttrMeta",0xd)
      ;
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_220,"():",3);
      poVar11 = (ostream *)::std::ostream::operator<<((ostringstream *)local_220,0xce8);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
      local_a8[0] = local_98;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_a8,"Invalid Property name `{}`: {}","");
      args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8;
      fmt::format<std::__cxx11::string,std::__cxx11::string>
                ((string *)&local_2e0,(fmt *)local_a8,&local_248,args,args_1);
      poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_220,(char *)local_2e0,local_2d8);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
      if (local_2e0 != (storage_t<double>)local_2d0) {
        operator_delete((void *)local_2e0,local_2d0[0] + 1);
      }
      if (local_a8[0] != local_98) {
        operator_delete(local_a8[0],local_98[0] + 1);
      }
      ::std::__cxx11::stringbuf::str();
      PushError(this,(string *)&local_2e0);
      if (local_2e0 != (storage_t<double>)local_2d0) {
        operator_delete((void *)local_2e0,local_2d0[0] + 1);
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_220);
      ::std::ios_base::~ios_base((ios_base *)local_1b0._M_local_buf);
      pAVar15 = local_2c0;
    }
    if (local_2b8 != (undefined1  [8])((long)local_2b0 + 8)) {
      operator_delete((void *)local_2b8,CONCAT71(local_2b0._9_7_,local_2b0[8]) + 1);
    }
    if (((!bVar7) || (bVar7 = SkipWhitespaceAndNewline(this,true), !bVar7)) ||
       (bVar7 = Expect(this,'='), !bVar7)) goto LAB_0038612c;
    uVar17 = 1;
    bVar7 = SkipWhitespaceAndNewline(this,true);
    if (!bVar7) goto LAB_0038612c;
    iVar9 = ::std::__cxx11::string::compare((char *)&local_248);
    if (iVar9 == 0) {
      local_220 = (undefined1  [8])local_210;
      local_218 = (undefined1  [8])0x0;
      local_210 = (undefined1  [8])((ulong)local_210 & 0xffffffffffffff00);
      bVar7 = ReadStringLiteral(this,(string *)local_220);
      if (bVar7) {
        InterpolationFromString((optional<tinyusdz::Interpolation> *)local_2b8,(string *)local_220);
        bVar18 = (pAVar15->interpolation).has_value_;
        if (bVar18 == true) {
          if (local_2b8[0] == (string)0x0) {
            (pAVar15->interpolation).has_value_ = false;
          }
          else {
LAB_0038680a:
            if (local_2b8[0] == (string)0x1) {
              (pAVar15->interpolation).contained =
                   (storage_t<tinyusdz::Interpolation>)local_2b8._4_4_;
            }
          }
        }
        else if (local_2b8[0] == (string)0x0) {
          if (bVar18 != false) goto LAB_0038680a;
        }
        else {
          (pAVar15->interpolation).contained = (storage_t<tinyusdz::Interpolation>)local_2b8._4_4_;
          (pAVar15->interpolation).has_value_ = true;
        }
      }
      if (local_220 != (undefined1  [8])local_210) {
        operator_delete((void *)local_220,(ulong)((long)local_210 + 1));
      }
      if (!bVar7) goto LAB_00386133;
LAB_0038748a:
      bVar7 = SkipWhitespaceAndNewline(this,true);
      uVar17 = (uint)!bVar7;
    }
    else {
      iVar9 = ::std::__cxx11::string::compare((char *)&local_248);
      if (iVar9 == 0) {
        bVar7 = ReadBasicType(this,(uint32_t *)&local_2e0);
        if (bVar7) {
          if ((pAVar15->elementSize).has_value_ == false) {
            (pAVar15->elementSize).contained = (storage_t<unsigned_int>)local_2e0._0_4_;
            (pAVar15->elementSize).has_value_ = true;
          }
          else {
            (pAVar15->elementSize).contained = (storage_t<unsigned_int>)local_2e0._0_4_;
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_220);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_220,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_220,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_220,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_220,"ParseAttrMeta",0xd);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_220,"():",3);
          poVar11 = (ostream *)::std::ostream::operator<<((ostringstream *)local_220,0xd06);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_220,"Failed to parse `elementSize`",0x1d);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_220,"\n",1);
          ::std::__cxx11::stringbuf::str();
          PushError(this,(string *)local_2b8);
          if (local_2b8 != (undefined1  [8])((long)local_2b0 + 8)) {
            operator_delete((void *)local_2b8,CONCAT71(local_2b0._9_7_,local_2b0[8]) + 1);
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_220);
          ::std::ios_base::~ios_base((ios_base *)local_1b0._M_local_buf);
        }
        if (bVar7) goto LAB_0038748a;
      }
      else {
        iVar9 = ::std::__cxx11::string::compare((char *)&local_248);
        if (iVar9 == 0) {
          local_2b8 = (undefined1  [8])((long)local_2b0 + 8);
          local_2b0._0_8_ = (pointer)0x0;
          local_2b0[8] = '\0';
          local_2e1 = ReadBasicType(this,(token *)local_2b8);
          if (local_2e1) {
            local_210 = (undefined1  [8])&linb::any::vtable_for_type<decltype(nullptr)>()::table;
            local_220 = (undefined1  [8])0x0;
            local_208._M_allocated_capacity = (size_type)auStack_1f8;
            local_208._M_local_buf[8] = false;
            local_208._M_local_buf[9] = false;
            local_208._10_2_ = 0;
            local_208._12_4_ = 0;
            auStack_1f8._0_4_ = auStack_1f8._0_4_ & 0xffffff00;
            local_2e0 = (storage_t<double>)local_2d0;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"colorSpace","");
            linb::any::operator=((any *)local_220,(Token *)local_2b8);
            ::std::__cxx11::string::_M_assign((string *)(local_210 + 8));
            if (local_2e0 != (storage_t<double>)local_2d0) {
              operator_delete((void *)local_2e0,local_2d0[0] + 1);
            }
            local_2e0 = (storage_t<double>)local_2d0;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"colorSpace","");
            pmVar12 = ::std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                      ::operator[](local_228,(key_type *)&local_2e0);
            ::std::__cxx11::string::_M_assign((string *)&pmVar12->_name);
            linb::any::operator=((any *)pmVar12,(any *)local_220);
            if (local_2e0 != (storage_t<double>)local_2d0) {
              operator_delete((void *)local_2e0,local_2d0[0] + 1);
            }
            MetaVariable::~MetaVariable((MetaVariable *)local_220);
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_220);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_220,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_220,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                       ,0x56);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_220,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_220,"ParseAttrMeta",0xd);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_220,"():",3);
            poVar11 = (ostream *)::std::ostream::operator<<((ostringstream *)local_220,0xd0e);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_220,"Failed to parse `colorSpace`",0x1c);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_220,"\n",1);
            ::std::__cxx11::stringbuf::str();
            PushError(this,(string *)&local_2e0);
            if (local_2e0 != (storage_t<double>)local_2d0) {
              operator_delete((void *)local_2e0,local_2d0[0] + 1);
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_220);
            ::std::ios_base::~ios_base((ios_base *)local_1b0._M_local_buf);
          }
          if (local_2b8 != (undefined1  [8])((long)local_2b0 + 8)) {
            operator_delete((void *)local_2b8,CONCAT71(local_2b0._9_7_,local_2b0[8]) + 1);
          }
LAB_0038693d:
          bVar7 = local_2e1 == false;
        }
        else {
          iVar9 = ::std::__cxx11::string::compare((char *)&local_248);
          if (iVar9 == 0) {
            local_2e1 = ReadBasicType(this,(int *)&local_2e0);
            if (local_2e1) {
              local_210 = (undefined1  [8])&linb::any::vtable_for_type<decltype(nullptr)>()::table;
              local_220 = (undefined1  [8])0x0;
              local_208._M_allocated_capacity = (size_type)auStack_1f8;
              local_208._M_local_buf[8] = false;
              local_208._M_local_buf[9] = false;
              local_208._10_2_ = 0;
              local_208._12_4_ = 0;
              auStack_1f8._0_4_ = auStack_1f8._0_4_ & 0xffffff00;
              local_2b8 = (undefined1  [8])((long)local_2b0 + 8);
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_2b8,"unauthoredValuesIndex","");
              linb::any::operator=((any *)local_220,(int *)&local_2e0);
              ::std::__cxx11::string::_M_assign((string *)(local_210 + 8));
              if (local_2b8 != (undefined1  [8])((long)local_2b0 + 8)) {
                operator_delete((void *)local_2b8,CONCAT71(local_2b0._9_7_,local_2b0[8]) + 1);
              }
              local_2b8 = (undefined1  [8])((long)local_2b0 + 8);
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_2b8,"unauthoredValuesIndex","");
              pmVar12 = ::std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                        ::operator[](local_228,(key_type *)local_2b8);
              ::std::__cxx11::string::_M_assign((string *)&pmVar12->_name);
              linb::any::operator=((any *)pmVar12,(any *)local_220);
              if (local_2b8 != (undefined1  [8])((long)local_2b0 + 8)) {
                operator_delete((void *)local_2b8,CONCAT71(local_2b0._9_7_,local_2b0[8]) + 1);
              }
              MetaVariable::~MetaVariable((MetaVariable *)local_220);
            }
            else {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_220);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_220,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_220,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                         ,0x56);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_220,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_220,"ParseAttrMeta",0xd);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_220,"():",3);
              poVar11 = (ostream *)::std::ostream::operator<<((ostringstream *)local_220,0xd17);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_220,"Failed to parse `unauthoredValuesIndex`",0x27);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_220,"\n",1);
              ::std::__cxx11::stringbuf::str();
              PushError(this,(string *)local_2b8);
              if (local_2b8 != (undefined1  [8])((long)local_2b0 + 8)) {
                operator_delete((void *)local_2b8,CONCAT71(local_2b0._9_7_,local_2b0[8]) + 1);
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_220);
              ::std::ios_base::~ios_base((ios_base *)local_1b0._M_local_buf);
            }
            goto LAB_0038693d;
          }
          iVar9 = ::std::__cxx11::string::compare((char *)&local_248);
          if (iVar9 == 0) {
            local_218 = (undefined1  [8])((ulong)local_218 & 0xffffffff00000000);
            local_210 = (undefined1  [8])0x0;
            local_208._M_allocated_capacity = (size_type)local_218;
            local_208._8_2_ = (undefined2)local_208._M_allocated_capacity;
            local_208._10_2_ = (undefined2)(local_208._M_allocated_capacity >> 0x10);
            local_208._12_4_ = (undefined4)(local_208._M_allocated_capacity >> 0x20);
            auStack_1f8._0_4_ = 0;
            auStack_1f8._4_4_ = 0;
            bVar7 = ParseDict(this,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                                    *)local_220);
            if (bVar7) {
              nonstd::optional_lite::
              optional<std::map<std::__cxx11::string,tinyusdz::MetaVariable,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::MetaVariable>>>>
              ::operator=(local_50,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                                    *)local_220);
            }
LAB_003867ee:
            ::std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
            ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                        *)local_220,(_Link_type)local_210);
LAB_00387470:
            bVar7 = bVar7 == false;
          }
          else {
            iVar9 = ::std::__cxx11::string::compare((char *)&local_248);
            if (iVar9 == 0) {
              bVar7 = ReadBasicType(this,(double *)&local_2e0);
              if (bVar7) {
                if ((local_2c0->weight).has_value_ == false) {
                  (local_2c0->weight).contained = local_2e0;
                  (local_2c0->weight).has_value_ = true;
                }
                else {
                  (local_2c0->weight).contained = local_2e0;
                }
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_220);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_220,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_220,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                           ,0x56);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_220,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_220,"ParseAttrMeta",0xd);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_220,"():",3);
                poVar11 = (ostream *)::std::ostream::operator<<((ostringstream *)local_220,0xd2b);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_220,"Failed to parse `weight`",0x18);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_220,"\n",1);
                ::std::__cxx11::stringbuf::str();
                PushError(this,(string *)local_2b8);
                if (local_2b8 != (undefined1  [8])((long)local_2b0 + 8)) {
                  operator_delete((void *)local_2b8,CONCAT71(local_2b0._9_7_,local_2b0[8]) + 1);
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_220);
                ::std::ios_base::~ios_base((ios_base *)local_1b0._M_local_buf);
              }
              goto LAB_00387470;
            }
            iVar9 = ::std::__cxx11::string::compare((char *)&local_248);
            if (iVar9 == 0) {
              local_2b8 = (undefined1  [8])((long)local_2b0 + 8);
              local_2b0._0_8_ = (pointer)0x0;
              local_2b0[8] = '\0';
              bVar7 = ReadBasicType(this,(token *)local_2b8);
              if (bVar7) {
                iVar9 = ::std::__cxx11::string::compare(local_2b8);
                this_00 = local_58;
                if ((iVar9 != 0) &&
                   (iVar9 = ::std::__cxx11::string::compare(local_2b8), this_00 = local_58,
                   iVar9 != 0)) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_220);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_220,"[warn]",6);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_220,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                             ,0x56);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_220,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_220,"ParseAttrMeta",0xd);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_220,"():",3)
                  ;
                  poVar11 = (ostream *)::std::ostream::operator<<((ostringstream *)local_220,0xd3a);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_220,"Unsupported token for bindMaterialAs: ",0x26);
                  poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_220,(char *)local_2b8,local_2b0._0_8_);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
                  ::std::__cxx11::stringbuf::str();
                  PushWarn(this,(string *)&local_2e0);
                  if (local_2e0 != (storage_t<double>)local_2d0) {
                    operator_delete((void *)local_2e0,local_2d0[0] + 1);
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_220);
                  ::std::ios_base::~ios_base((ios_base *)local_1b0._M_local_buf);
                  this_00 = local_58;
                }
                goto LAB_00386b1f;
              }
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_220);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_220,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_220,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                         ,0x56);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_220,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_220,"ParseAttrMeta",0xd);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_220,"():",3);
              poVar11 = (ostream *)::std::ostream::operator<<((ostringstream *)local_220,0xd33);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
              lVar14 = 0x20;
              pcVar16 = "Failed to parse `bindMaterialAs`";
LAB_003873dc:
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_220,pcVar16,lVar14);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_220,"\n",1);
              ::std::__cxx11::stringbuf::str();
              PushError(this,(string *)&local_2e0);
              if (local_2e0 != (storage_t<double>)local_2d0) {
                operator_delete((void *)local_2e0,local_2d0[0] + 1);
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_220);
              ::std::ios_base::~ios_base((ios_base *)local_1b0._M_local_buf);
LAB_00387454:
              if (local_2b8 != (undefined1  [8])((long)local_2b0 + 8)) {
                operator_delete((void *)local_2b8,CONCAT71(local_2b0._9_7_,local_2b0[8]) + 1);
              }
              goto LAB_00387470;
            }
            iVar9 = ::std::__cxx11::string::compare((char *)&local_248);
            if (iVar9 == 0) {
              local_2b8 = (undefined1  [8])((long)local_2b0 + 8);
              local_2b0._0_8_ = (pointer)0x0;
              local_2b0[8] = '\0';
              bVar7 = ReadStringLiteral(this,(string *)local_2b8);
              this_01 = local_60;
              if (!bVar7) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_220);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_220,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_220,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                           ,0x56);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_220,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_220,"ParseAttrMeta",0xd);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_220,"():",3);
                poVar11 = (ostream *)::std::ostream::operator<<((ostringstream *)local_220,0xd41);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
                lVar14 = 0x2a;
                pcVar16 = "Failed to parse `displayName`(string type)";
                goto LAB_003873dc;
              }
LAB_00386d86:
              nonstd::optional_lite::optional<std::__cxx11::string>::operator=
                        (this_01,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_2b8);
              goto LAB_00387454;
            }
            iVar9 = ::std::__cxx11::string::compare((char *)&local_248);
            if (iVar9 == 0) {
              local_2b8 = (undefined1  [8])((long)local_2b0 + 8);
              local_2b0._0_8_ = (pointer)0x0;
              local_2b0[8] = '\0';
              bVar7 = ReadStringLiteral(this,(string *)local_2b8);
              this_01 = local_68;
              if (bVar7) goto LAB_00386d86;
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_220);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_220,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_220,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                         ,0x56);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_220,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_220,"ParseAttrMeta",0xd);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_220,"():",3);
              poVar11 = (ostream *)::std::ostream::operator<<((ostringstream *)local_220,0xd48);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
              lVar14 = 0x2b;
              pcVar16 = "Failed to parse `displayGroup`(string type)";
              goto LAB_003873dc;
            }
            iVar9 = ::std::__cxx11::string::compare((char *)&local_248);
            if (iVar9 == 0) {
              local_2b8 = (undefined1  [8])((long)local_2b0 + 8);
              local_2b0._0_8_ = (pointer)0x0;
              local_2b0[8] = '\0';
              bVar7 = ReadBasicType(this,(token *)local_2b8);
              this_00 = local_70;
              if (!bVar7) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_220);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_220,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_220,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                           ,0x56);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_220,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_220,"ParseAttrMeta",0xd);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_220,"():",3);
                poVar11 = (ostream *)::std::ostream::operator<<((ostringstream *)local_220,0xd50);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
                lVar14 = 0x20;
                pcVar16 = "Failed to parse `connectability`";
                goto LAB_003873dc;
              }
LAB_00386b1f:
              nonstd::optional_lite::optional<tinyusdz::Token>::operator=
                        (this_00,(Token *)local_2b8);
              goto LAB_00387454;
            }
            iVar9 = ::std::__cxx11::string::compare((char *)&local_248);
            if (iVar9 == 0) {
              local_2b8 = (undefined1  [8])((long)local_2b0 + 8);
              local_2b0._0_8_ = (pointer)0x0;
              local_2b0[8] = '\0';
              bVar7 = ReadBasicType(this,(token *)local_2b8);
              this_00 = local_78;
              if (!bVar7) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_220);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_220,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_220,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                           ,0x56);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_220,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_220,"ParseAttrMeta",0xd);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_220,"():",3);
                poVar11 = (ostream *)::std::ostream::operator<<((ostringstream *)local_220,0xd57);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
                lVar14 = 0x1c;
                pcVar16 = "Failed to parse `renderType`";
                goto LAB_003873dc;
              }
              goto LAB_00386b1f;
            }
            iVar9 = ::std::__cxx11::string::compare((char *)&local_248);
            if (iVar9 == 0) {
              local_2b8 = (undefined1  [8])((long)local_2b0 + 8);
              local_2b0._0_8_ = (pointer)0x0;
              local_2b0[8] = '\0';
              bVar7 = ReadBasicType(this,(token *)local_2b8);
              this_00 = local_80;
              if (!bVar7) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_220);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_220,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_220,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                           ,0x56);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_220,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_220,"ParseAttrMeta",0xd);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_220,"():",3);
                poVar11 = (ostream *)::std::ostream::operator<<((ostringstream *)local_220,0xd5e);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
                lVar14 = 0x1c;
                pcVar16 = "Failed to parse `outputName`";
                goto LAB_003873dc;
              }
              goto LAB_00386b1f;
            }
            iVar9 = ::std::__cxx11::string::compare((char *)&local_248);
            if (iVar9 == 0) {
              local_218 = (undefined1  [8])((ulong)local_218 & 0xffffffff00000000);
              local_210 = (undefined1  [8])0x0;
              local_208._M_allocated_capacity = (size_type)local_218;
              local_208._8_2_ = (undefined2)local_208._M_allocated_capacity;
              local_208._10_2_ = (undefined2)(local_208._M_allocated_capacity >> 0x10);
              local_208._12_4_ = (undefined4)(local_208._M_allocated_capacity >> 0x20);
              auStack_1f8._0_4_ = 0;
              auStack_1f8._4_4_ = 0;
              bVar7 = ParseDict(this,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                                      *)local_220);
              if (bVar7) {
                nonstd::optional_lite::
                optional<std::map<std::__cxx11::string,tinyusdz::MetaVariable,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::MetaVariable>>>>
                ::operator=(local_88,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                                      *)local_220);
              }
              goto LAB_003867ee;
            }
            GetPropMetaDefinition
                      ((optional<tinyusdz::ascii::AsciiParser::VariableDef> *)local_220,this,
                       &local_248);
            local_2b8[0] = (string)local_220[0];
            if ((ostringstream)local_220[0] == (ostringstream)0x1) {
              VariableDef::VariableDef((VariableDef *)local_2b0,(VariableDef *)local_218);
            }
            if ((ostringstream)local_220[0] == (ostringstream)0x1) {
              nonstd::optional_lite::detail::storage_t<tinyusdz::ascii::AsciiParser::VariableDef>::
              destruct_value((storage_t<tinyusdz::ascii::AsciiParser::VariableDef> *)local_218);
            }
            if (local_2b8[0] == (string)0x1) {
              local_210 = (undefined1  [8])&linb::any::vtable_for_type<decltype(nullptr)>()::table;
              local_220 = (undefined1  [8])0x0;
              local_208._M_allocated_capacity = (size_type)auStack_1f8;
              local_208._M_local_buf[8] = false;
              local_208._M_local_buf[9] = false;
              local_208._10_2_ = 0;
              local_208._12_4_ = 0;
              auStack_1f8._0_4_ = auStack_1f8._0_4_ & 0xffffff00;
              bVar7 = ParseMetaValue(this,(VariableDef *)local_2b0,(MetaVariable *)local_220);
              if (bVar7) {
                ::std::__cxx11::string::_M_assign((string *)(local_210 + 8));
                pmVar12 = ::std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                          ::operator[](local_228,&local_248);
                ::std::__cxx11::string::_M_assign((string *)&pmVar12->_name);
                linb::any::operator=((any *)pmVar12,(any *)local_220);
              }
              MetaVariable::~MetaVariable((MetaVariable *)local_220);
            }
            else {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_220);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_220,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_220,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                         ,0x56);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_220,"[ASCII]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_220,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_220,"ParseAttrMeta",0xd);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_220,"():",3);
              poVar11 = (ostream *)::std::ostream::operator<<((ostringstream *)local_220,0xd7e);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
              local_a8[0] = local_98;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_a8,
                         "[InternalErrror] Failed to parse Property metadataum `{}`","");
              fmt::format<std::__cxx11::string>
                        ((string *)&local_2e0,(fmt *)local_a8,(string *)&local_248,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
              poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_220,(char *)local_2e0,local_2d8);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
              if (local_2e0 != (storage_t<double>)local_2d0) {
                operator_delete((void *)local_2e0,local_2d0[0] + 1);
              }
              if (local_a8[0] != local_98) {
                operator_delete(local_a8[0],local_98[0] + 1);
              }
              ::std::__cxx11::stringbuf::str();
              PushError(this,(string *)&local_2e0);
              if (local_2e0 != (storage_t<double>)local_2d0) {
                operator_delete((void *)local_2e0,local_2d0[0] + 1);
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_220);
              ::std::ios_base::~ios_base((ios_base *)local_1b0._M_local_buf);
              bVar7 = false;
            }
            if (local_2b8[0] == (string)0x1) {
              nonstd::optional_lite::detail::storage_t<tinyusdz::ascii::AsciiParser::VariableDef>::
              destruct_value((storage_t<tinyusdz::ascii::AsciiParser::VariableDef> *)local_2b0);
            }
            bVar7 = bVar7 == false;
          }
        }
        if (!bVar7) goto LAB_0038748a;
      }
    }
  }
  else {
LAB_0038612c:
    uVar17 = 1;
  }
LAB_00386133:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,
                    CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                             local_248.field_2._M_local_buf[0]) + 1);
  }
LAB_0038615f:
  uVar8 = (*(code *)(&DAT_00409a48 + *(int *)(&DAT_00409a48 + (ulong)uVar17 * 4)))();
  return (bool)uVar8;
}

Assistant:

bool AsciiParser::ParseAttrMeta(AttrMeta *out_meta) {
  // '(' metas ')'
  //
  // currently we only support 'interpolation', 'elementSize' and 'cutomData'

  if (!SkipWhitespace()) {
    return false;
  }

  // The first character.
  {
    char c;
    if (!Char1(&c)) {
      // this should not happen.
      return false;
    }

    if (c == '(') {
      // ok
    } else {
      _sr->seek_from_current(-1);

      // Still ok. No meta
      DCOUT("No attribute meta.");
      return true;
    }
  }

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  while (!Eof()) {
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == ')') {
      // end meta
      break;
    } else {
      if (!Rewind(1)) {
        return false;
      }

      // May be string only
      {
        value::StringData sdata;
        if (MaybeTripleQuotedString(&sdata)) {
          out_meta->stringData.push_back(sdata);

          DCOUT("Add triple-quoted string to attr meta:" << to_string(sdata));
          if (!SkipWhitespaceAndNewline()) {
            return false;
          }
          continue;
        } else if (MaybeString(&sdata)) {
          out_meta->stringData.push_back(sdata);

          DCOUT("Add string to attr meta:" << to_string(sdata));
          if (!SkipWhitespaceAndNewline()) {
            return false;
          }
          continue;
        }
      }

      std::string varname;
      if (!ReadIdentifier(&varname)) {
        return false;
      }

      DCOUT("Property/Attribute meta name: " << varname);

      bool supported = _supported_prop_metas.count(varname);
      if (!supported) {
        PUSH_ERROR_AND_RETURN_TAG(
            kAscii,
            fmt::format("Unsupported Property metadatum name: {}", varname));
      }

      {
        std::string name_err;
        if (!pathutil::ValidatePropPath(Path("", varname), &name_err)) {
          PUSH_ERROR_AND_RETURN_TAG(
              kAscii,
              fmt::format("Invalid Property name `{}`: {}", varname, name_err));
        }
      }

      if (!SkipWhitespaceAndNewline()) {
        return false;
      }

      if (!Expect('=')) {
        return false;
      }

      if (!SkipWhitespaceAndNewline()) {
        return false;
      }

      //
      // First-class predefind prop metas.
      //
      if (varname == "interpolation") {
        std::string value;
        if (!ReadStringLiteral(&value)) {
          return false;
        }

        DCOUT("Got `interpolation` meta : " << value);
        out_meta->interpolation = InterpolationFromString(value);
      } else if (varname == "elementSize") {
        uint32_t value;
        if (!ReadBasicType(&value)) {
          PUSH_ERROR_AND_RETURN("Failed to parse `elementSize`");
        }

        DCOUT("Got `elementSize` meta : " << value);
        out_meta->elementSize = value;
      } else if (varname == "colorSpace") {
        value::token tok;
        if (!ReadBasicType(&tok)) {
          PUSH_ERROR_AND_RETURN("Failed to parse `colorSpace`");
        }
        // Add as custom meta value.
        MetaVariable metavar;
        metavar.set_value("colorSpace", tok);
        out_meta->meta["colorSpace"] = metavar;
      } else if (varname == "unauthoredValuesIndex") {
        int value;
        if (!ReadBasicType(&value)) {
          PUSH_ERROR_AND_RETURN("Failed to parse `unauthoredValuesIndex`");
        }

        DCOUT("Got `unauthoredValuesIndex` meta : " << value);
        MetaVariable metavar;
        metavar.set_value("unauthoredValuesIndex", value);
        out_meta->meta["unauthoredValuesIndex"] = metavar;
      } else if (varname == "customData") {
        Dictionary dict;

        if (!ParseDict(&dict)) {
          return false;
        }

        DCOUT("Got `customData` meta");
        out_meta->customData = dict;

      } else if (varname == "weight") {
        double value;
        if (!ReadBasicType(&value)) {
          PUSH_ERROR_AND_RETURN("Failed to parse `weight`");
        }

        DCOUT("Got `weight` meta : " << value);
        out_meta->weight = value;
      } else if (varname == "bindMaterialAs") {
        value::token tok;
        if (!ReadBasicType(&tok)) {
          PUSH_ERROR_AND_RETURN("Failed to parse `bindMaterialAs`");
        }
        if ((tok.str() == kWeaderThanDescendants) ||
            (tok.str() == kStrongerThanDescendants)) {
          // ok
        } else {
          // still valid though
          PUSH_WARN("Unsupported token for bindMaterialAs: " << tok.str());
        }
        DCOUT("bindMaterialAs: " << tok);
        out_meta->bindMaterialAs = tok;
      } else if (varname == "displayName") {
        std::string str;
        if (!ReadStringLiteral(&str)) {
          PUSH_ERROR_AND_RETURN("Failed to parse `displayName`(string type)");
        }
        DCOUT("displayName: " << str);
        out_meta->displayName = str;
      } else if (varname == "displayGroup") {
        std::string str;
        if (!ReadStringLiteral(&str)) {
          PUSH_ERROR_AND_RETURN("Failed to parse `displayGroup`(string type)");
        }
        DCOUT("displayGroup: " << str);
        out_meta->displayGroup = str;

      } else if (varname == "connectability") {
        value::token tok;
        if (!ReadBasicType(&tok)) {
          PUSH_ERROR_AND_RETURN("Failed to parse `connectability`");
        }
        DCOUT("connectability: " << tok);
        out_meta->connectability = tok;
      } else if (varname == "renderType") {
        value::token tok;
        if (!ReadBasicType(&tok)) {
          PUSH_ERROR_AND_RETURN("Failed to parse `renderType`");
        }
        DCOUT("renderType: " << tok);
        out_meta->renderType = tok;
      } else if (varname == "outputName") {
        value::token tok;
        if (!ReadBasicType(&tok)) {
          PUSH_ERROR_AND_RETURN("Failed to parse `outputName`");
        }
        DCOUT("outputName: " << tok);
        out_meta->outputName = tok;
      } else if (varname == "sdrMetadata") {
        Dictionary dict;

        if (!ParseDict(&dict)) {
          return false;
        }

        out_meta->sdrMetadata = dict;
      } else {
        if (auto pv = GetPropMetaDefinition(varname)) {
          // Parse as generic metadata variable
          MetaVariable metavar;
          const auto &vardef = pv.value();

          if (!ParseMetaValue(vardef, &metavar)) {
            return false;
          }
          metavar.set_name(varname);

          // add to custom meta
          out_meta->meta[varname] = metavar;

        } else {
          // This should not happen though.
          PUSH_ERROR_AND_RETURN_TAG(
              kAscii,
              fmt::format(
                  "[InternalErrror] Failed to parse Property metadataum `{}`",
                  varname));
        }
      }

      if (!SkipWhitespaceAndNewline()) {
        return false;
      }
    }
  }

  return true;
}